

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  mapped_type *this_00;
  size_type sVar8;
  reference pvVar9;
  value_type_conflict1 local_d9c;
  ulong local_d98;
  long lineIdx;
  undefined1 local_d70 [8];
  ostringstream cmCTestLog_msg_5;
  string local_bf8 [36];
  int local_bd4;
  ulong uStack_bd0;
  int cov;
  size_type pos;
  string nl;
  long cnt;
  undefined1 local_b80 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_a08 [8];
  ifstream ifile;
  string local_800 [32];
  undefined1 local_7e0 [8];
  ostringstream cmCTestLog_msg_3;
  SingleFileCoverageVector *vec;
  undefined1 local_640 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_4c8 [8];
  string actualSourceFile;
  undefined1 local_488 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_310 [8];
  string fileName;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int file_count;
  undefined1 local_2c0 [8];
  string tempDir;
  undefined1 local_280 [8];
  string testingDir;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string daGlob;
  undefined1 local_78 [8];
  Glob gl;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  gl._80_8_ = cont;
  cmsys::Glob::Glob((Glob *)local_78);
  cmsys::Glob::RecurseOn((Glob *)local_78);
  cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (gl._80_8_ + 0x28),"/*.cover");
  cmsys::Glob::FindFiles
            ((Glob *)local_78,
             (string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0,__x);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    poVar6 = std::operator<<((ostream *)local_238," Cannot find any Python Trace.py coverage files."
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x63c,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    this_local._4_4_ = 0;
    testingDir.field_2._12_4_ = 1;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)((long)&tempDir.field_2 + 8),(this->super_cmCTestGenericHandler).CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tempDir.field_2 + 8),"/Testing");
    std::__cxx11::string::~string((string *)(tempDir.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   "/CoverageInfo");
    cmsys::SystemTools::MakeDirectory((string *)local_2c0,(mode_t *)0x0);
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar3) {
      fileName.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      FindFile((string *)local_310,this,(cmCTestCoverageHandlerContainer *)gl._80_8_,
               (string *)fileName.field_2._8_8_);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmsys::SystemTools::CollapseFullPath((string *)local_4c8,(string *)local_310);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
        poVar6 = std::operator<<((ostream *)local_640,"   Check coverage for file: ");
        poVar6 = std::operator<<(poVar6,(string *)local_4c8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x653,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&vec);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                *)(gl._80_8_ + 0x48),(key_type *)local_4c8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
        poVar6 = std::operator<<((ostream *)local_7e0,"   in file: ");
        poVar6 = std::operator<<(poVar6,(string *)fileName.field_2._8_8_);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x657,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_800);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(local_a08,pcVar7,_S_in);
        bVar4 = std::ios::operator!((ios *)(local_a08 +
                                           (long)*(_func_int **)((long)local_a08 + -0x18)));
        if ((bVar4 & 1) == 0) {
          nl.field_2._8_8_ = 0xffffffffffffffff;
          std::__cxx11::string::string((string *)&pos);
          while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)local_a08,(string *)&pos,(bool *)0x0,
                                    0xffffffffffffffff), bVar3) {
            nl.field_2._8_8_ = nl.field_2._8_8_ + 1;
            uVar5 = std::__cxx11::string::empty();
            if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::size(), 0xb < uVar5)) {
              local_bd4 = 0;
              uStack_bd0 = 5;
              while( true ) {
                if ((7 < uStack_bd0) ||
                   (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&pos), *pcVar7 == ' '))
                goto LAB_0039ea0c;
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&pos);
                if (*pcVar7 == ':') break;
                uStack_bd0 = uStack_bd0 + 1;
              }
              std::__cxx11::string::substr((ulong)local_bf8,(ulong)&pos);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              local_bd4 = atoi(pcVar7);
              std::__cxx11::string::~string(local_bf8);
LAB_0039ea0c:
              if (uStack_bd0 == 8) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d70);
                poVar6 = std::operator<<((ostream *)local_d70,
                                         "Currently the limit is maximum coverage of 999999");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar7 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x680,pcVar7,false);
                std::__cxx11::string::~string((string *)&lineIdx);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d70);
              }
              local_d98 = nl.field_2._8_8_;
              if (-1 < (long)nl.field_2._8_8_) {
                while (sVar8 = std::vector<int,_std::allocator<int>_>::size(this_00),
                      sVar8 <= local_d98) {
                  local_d9c = -1;
                  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_d9c);
                }
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_d98);
                if ((*pvVar9 < 0) && (-1 < local_bd4)) {
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_d98);
                  *pvVar9 = 0;
                }
                iVar2 = local_bd4;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_d98);
                *pvVar9 = iVar2 + *pvVar9;
              }
            }
          }
          std::__cxx11::string::~string((string *)&pos);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b80);
          poVar6 = std::operator<<((ostream *)local_b80,"Cannot open file: ");
          poVar6 = std::operator<<(poVar6,(string *)fileName.field_2._8_8_);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x65b,pcVar7,false);
          std::__cxx11::string::~string((string *)&cnt);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b80);
        }
        __range1._4_4_ = __range1._4_4_ + 1;
        std::ifstream::~ifstream(local_a08);
        std::__cxx11::string::~string((string *)local_4c8);
        testingDir.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
        poVar6 = std::operator<<((ostream *)local_488,
                                 "Cannot find source Python file corresponding to: ");
        poVar6 = std::operator<<(poVar6,(string *)fileName.field_2._8_8_);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x64b,pcVar7,false);
        std::__cxx11::string::~string((string *)(actualSourceFile.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
        testingDir.field_2._12_4_ = 5;
      }
      std::__cxx11::string::~string((string *)local_310);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = __range1._4_4_;
    testingDir.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_280);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::Glob::~Glob((Glob *)local_78);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string::size_type pos;
        int cov = 0;
        // This is a hack. We should really do something more elaborate
        for (pos = 5; pos < 8; pos++) {
          if (nl[pos] == ' ') {
            // This line does not have ':' so no coverage here. That said,
            // Trace.py does not handle not covered lines versus comments etc.
            // So, this will be set to 0.
            break;
          }
          if (nl[pos] == ':') {
            cov = atoi(nl.substr(0, pos - 1).c_str());
            break;
          }
        }
        if (pos == 8) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Currently the limit is maximum coverage of 999999"
                       << std::endl);
        }
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}